

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O1

void __thiscall cs::statement_if::run_impl(statement_if *this)

{
  context_t *pcVar1;
  bool bVar2;
  _Elt_pointer ppsVar3;
  statement_base *psVar4;
  element_type *peVar5;
  undefined *puVar6;
  bool *pbVar7;
  _Elt_pointer ppsVar8;
  _Map_pointer pppsVar9;
  _Elt_pointer ppsVar10;
  scope_guard scope;
  scope_guard local_a0;
  slot_type *local_98;
  
  local_98 = (slot_type *)(this->mTree).mRoot;
  runtime_type::parse_expr
            ((runtime_type *)&stack0xffffffffffffff60,
             (iterator *)
             (((this->super_statement_base).context.
               super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance).
             super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             SUB81(&stack0xffffffffffffff68,0));
  pbVar7 = cs_impl::any::const_val<bool>((any *)&stack0xffffffffffffff60);
  bVar2 = *pbVar7;
  cs_impl::any::recycle((any *)&stack0xffffffffffffff60);
  if (bVar2 == true) {
    pcVar1 = &(this->super_statement_base).context;
    local_a0.context = pcVar1;
    domain_manager::add_domain
              (&(((((this->super_statement_base).context.
                    super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->super_runtime_type).storage);
    ppsVar10 = (this->mBlock).
               super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_cur;
    ppsVar3 = (this->mBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_finish._M_cur;
    if (ppsVar10 != ppsVar3) {
      ppsVar8 = (this->mBlock).
                super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                _M_impl.super__Deque_impl_data._M_start._M_last;
      pppsVar9 = (this->mBlock).
                 super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_node;
      do {
        puVar6 = current_process;
        psVar4 = *ppsVar10;
        if ((*current_process & 1) != 0) {
          LOCK();
          *current_process = 0;
          UNLOCK();
          event_type::touch((event_type *)(puVar6 + 0xd0),(void *)0x0);
        }
        (*psVar4->_vptr_statement_base[3])(psVar4);
        peVar5 = (((pcVar1->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  )->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (((peVar5->return_fcall != false) || (peVar5->break_block != false)) ||
           (peVar5->continue_block != false)) break;
        ppsVar10 = ppsVar10 + 1;
        if (ppsVar10 == ppsVar8) {
          ppsVar10 = pppsVar9[1];
          pppsVar9 = pppsVar9 + 1;
          ppsVar8 = ppsVar10 + 0x40;
        }
      } while (ppsVar10 != ppsVar3);
    }
    scope_guard::~scope_guard(&stack0xffffffffffffff60);
  }
  return;
}

Assistant:

void statement_if::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		if (context->instance->parse_expr(mTree.root()).const_val<boolean>()) {
			scope_guard scope(context);
			for (auto &ptr: mBlock) {
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
				}
				if (context->instance->return_fcall || context->instance->break_block ||
				        context->instance->continue_block)
					break;
			}
		}
	}